

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getInputPrimitiveTypeQualifier_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this,
          GLenum gs_input_primitive_type)

{
  GLenum gs_input_primitive_type_local;
  GeometryShaderInvalidArrayedInputVariablesTest *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(gs_input_primitive_type) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"points");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"lines");
    break;
  default:
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"triangles");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"lines_adjacency");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"triangles_adjacency");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getInputPrimitiveTypeQualifier(
	glw::GLenum gs_input_primitive_type) const
{
	std::string result;

	switch (gs_input_primitive_type)
	{
	case GL_POINTS:
		result = "points";
		break;
	case GL_LINES:
		result = "lines";
		break;
	case GL_LINES_ADJACENCY:
		result = "lines_adjacency";
		break;
	case GL_TRIANGLES:
		result = "triangles";
		break;
	case GL_TRIANGLES_ADJACENCY:
		result = "triangles_adjacency";
		break;

	default:
	{
		DE_ASSERT(0);
	}
	} /* switch (gs_input_primitive_type) */

	return result;
}